

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RegexpMatchesBindData::Copy(RegexpMatchesBindData *this)

{
  long in_RSI;
  _func_int **local_18;
  
  make_uniq<duckdb::RegexpMatchesBindData,duckdb_re2::RE2::Options_const&,std::__cxx11::string_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool_const&>
            ((duckdb *)&local_18,(Options *)(in_RSI + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x20),
             (bool *)(in_RSI + 0x40),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x48),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x68),
             (bool *)(in_RSI + 0x88));
  (this->super_RegexpBaseBindData).super_FunctionData._vptr_FunctionData = local_18;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> RegexpMatchesBindData::Copy() const {
	return make_uniq<RegexpMatchesBindData>(options, constant_string, constant_pattern, range_min, range_max,
	                                        range_success);
}